

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

string * slang::ast::flagsToStr_abi_cxx11_(bitmask<slang::ast::ConstraintBlockFlags> flags)

{
  bool bVar1;
  undefined1 in_SIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  bitmask<slang::ast::ConstraintBlockFlags> local_22;
  bitmask<slang::ast::ConstraintBlockFlags> local_21;
  bitmask<slang::ast::ConstraintBlockFlags> local_20;
  bitmask<slang::ast::ConstraintBlockFlags> local_1f;
  bitmask<slang::ast::ConstraintBlockFlags> local_1e;
  bitmask<slang::ast::ConstraintBlockFlags> local_1d [13];
  uint6 in_stack_fffffffffffffff0;
  
  this = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_SIL,(uint7)in_stack_fffffffffffffff0));
  bitmask<slang::ast::ConstraintBlockFlags>::bitmask
            ((bitmask<slang::ast::ConstraintBlockFlags> *)&stack0xfffffffffffffff5,Pure);
  bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                    ((bitmask<slang::ast::ConstraintBlockFlags> *)this,
                     (bitmask<slang::ast::ConstraintBlockFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::ConstraintBlockFlags>::bitmask(local_1d,Static);
  bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                    ((bitmask<slang::ast::ConstraintBlockFlags> *)this,
                     (bitmask<slang::ast::ConstraintBlockFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_1e,Extern);
  bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                    ((bitmask<slang::ast::ConstraintBlockFlags> *)this,
                     (bitmask<slang::ast::ConstraintBlockFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_1f,ExplicitExtern);
  bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                    ((bitmask<slang::ast::ConstraintBlockFlags> *)this,
                     (bitmask<slang::ast::ConstraintBlockFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_20,Initial);
  bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                    ((bitmask<slang::ast::ConstraintBlockFlags> *)this,
                     (bitmask<slang::ast::ConstraintBlockFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_21,Extends);
  bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                    ((bitmask<slang::ast::ConstraintBlockFlags> *)this,
                     (bitmask<slang::ast::ConstraintBlockFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bitmask<slang::ast::ConstraintBlockFlags>::bitmask(&local_22,Final);
  bVar1 = bitmask<slang::ast::ConstraintBlockFlags>::has
                    ((bitmask<slang::ast::ConstraintBlockFlags> *)this,
                     (bitmask<slang::ast::ConstraintBlockFlags> *)in_RDI);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,(char *)in_RDI);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fe703);
  if (!bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back(this);
  }
  return this;
}

Assistant:

static std::string flagsToStr(bitmask<ConstraintBlockFlags> flags) {
    std::string str;
    if (flags.has(ConstraintBlockFlags::Pure))
        str += "pure,";
    if (flags.has(ConstraintBlockFlags::Static))
        str += "static,";
    if (flags.has(ConstraintBlockFlags::Extern))
        str += "extern,";
    if (flags.has(ConstraintBlockFlags::ExplicitExtern))
        str += "explicitExtern,";
    if (flags.has(ConstraintBlockFlags::Initial))
        str += "initial,";
    if (flags.has(ConstraintBlockFlags::Extends))
        str += "extends,";
    if (flags.has(ConstraintBlockFlags::Final))
        str += "final,";
    if (!str.empty())
        str.pop_back();
    return str;
}